

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# futex_waiter.cc
# Opt level: O3

int absl::lts_20240722::synchronization_internal::FutexWaiter::WaitUntil
              (atomic<int> *v,int32_t val,KernelTimeout t)

{
  int iVar1;
  __syscall_slong_t extraout_RDX;
  __syscall_slong_t extraout_RDX_00;
  timespec abs_timespec;
  timespec local_20;
  
  if (t.rep_ != 0xffffffffffffffff) {
    if ((t.rep_ & 1) == 0) {
      local_20.tv_sec =
           absl::lts_20240722::synchronization_internal::KernelTimeout::MakeAbsTimespec();
      local_20.tv_nsec = extraout_RDX;
      iVar1 = FutexImpl::WaitAbsoluteTimeout(v,val,&local_20);
    }
    else {
      local_20.tv_sec =
           absl::lts_20240722::synchronization_internal::KernelTimeout::MakeRelativeTimespec();
      local_20.tv_nsec = extraout_RDX_00;
      iVar1 = FutexImpl::WaitRelativeTimeout(v,val,&local_20);
    }
    return iVar1;
  }
  iVar1 = FutexImpl::WaitAbsoluteTimeout(v,val,(timespec *)0x0);
  return iVar1;
}

Assistant:

int FutexWaiter::WaitUntil(std::atomic<int32_t>* v, int32_t val,
                           KernelTimeout t) {
#ifdef CLOCK_MONOTONIC
  constexpr bool kHasClockMonotonic = true;
#else
  constexpr bool kHasClockMonotonic = false;
#endif

  // We can't call Futex::WaitUntil() here because the prodkernel implementation
  // does not know about KernelTimeout::SupportsSteadyClock().
  if (!t.has_timeout()) {
    return Futex::Wait(v, val);
  } else if (kHasClockMonotonic && KernelTimeout::SupportsSteadyClock() &&
             t.is_relative_timeout()) {
    auto rel_timespec = t.MakeRelativeTimespec();
    return Futex::WaitRelativeTimeout(v, val, &rel_timespec);
  } else {
    auto abs_timespec = t.MakeAbsTimespec();
    return Futex::WaitAbsoluteTimeout(v, val, &abs_timespec);
  }
}